

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

int ogg_stream_reset(ogg_stream_state *os)

{
  int iVar1;
  ogg_stream_state *os_local;
  
  iVar1 = ogg_stream_check(os);
  if (iVar1 == 0) {
    os->body_fill = 0;
    os->body_returned = 0;
    os->lacing_fill = 0;
    os->lacing_packet = 0;
    os->lacing_returned = 0;
    os->header_fill = 0;
    os->e_o_s = 0;
    os->b_o_s = 0;
    os->pageno = -1;
    os->packetno = 0;
    os->granulepos = 0;
    os_local._4_4_ = 0;
  }
  else {
    os_local._4_4_ = -1;
  }
  return os_local._4_4_;
}

Assistant:

int ogg_stream_reset(ogg_stream_state *os){
  if(ogg_stream_check(os)) return -1;

  os->body_fill=0;
  os->body_returned=0;

  os->lacing_fill=0;
  os->lacing_packet=0;
  os->lacing_returned=0;

  os->header_fill=0;

  os->e_o_s=0;
  os->b_o_s=0;
  os->pageno=-1;
  os->packetno=0;
  os->granulepos=0;

  return(0);
}